

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O2

int obudec_read_leb128(AvxInputContext *input_ctx,uint8_t *value_buffer,size_t *value_length,
                      uint64_t *value,_Bool buffered)

{
  uchar *buf;
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  size_t available;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(input_ctx == (AvxInputContext *)0x0);
  auVar5._4_4_ = -(uint)(value_buffer == (uint8_t *)0x0);
  auVar5._8_4_ = -(uint)(value_length == (size_t *)0x0);
  auVar5._12_4_ = -(uint)(value == (uint64_t *)0x0);
  iVar4 = movmskps((int)value_buffer,auVar5);
  iVar2 = -1;
  if (iVar4 == 0) {
    available = 0;
    while( true ) {
      if (available == 8) {
        available = 8;
        goto LAB_00121fcd;
      }
      buf = value_buffer + available;
      sVar3 = buffer_input(input_ctx,1,buf,buffered);
      if (sVar3 == 0) break;
      available = available + 1;
      if (-1 < (char)*buf) {
        *value_length = available;
LAB_00121fcd:
        iVar2 = aom_uleb_decode(value_buffer,available,value,(size_t *)0x0);
        return iVar2;
      }
    }
    if (available == 0) {
      _Var1 = input_eof(input_ctx);
      iVar2 = -1;
      if (_Var1) {
        *value_length = 0;
        iVar2 = 0;
      }
    }
    else {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static int obudec_read_leb128(struct AvxInputContext *input_ctx,
                              uint8_t *value_buffer, size_t *value_length,
                              uint64_t *value, bool buffered) {
  if (!input_ctx || !value_buffer || !value_length || !value) return -1;
  size_t len;
  for (len = 0; len < OBU_MAX_LENGTH_FIELD_SIZE; ++len) {
    const size_t num_read =
        buffer_input(input_ctx, 1, &value_buffer[len], buffered);
    if (num_read == 0) {
      if (len == 0 && input_eof(input_ctx)) {
        *value_length = 0;
        return 0;
      }
      // Ran out of data before completing read of value.
      return -1;
    }
    if ((value_buffer[len] >> 7) == 0) {
      ++len;
      *value_length = len;
      break;
    }
  }

  return aom_uleb_decode(value_buffer, len, value, NULL);
}